

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_rawset(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  StkId pTVar3;
  
  pTVar1 = index2addr(L,idx);
  pTVar3 = L->top;
  pTVar2 = luaH_set(L,&((pTVar1->value_).gc)->h,pTVar3 + -2);
  pTVar2->value_ = pTVar3[-1].value_;
  pTVar2->tt_ = pTVar3[-1].tt_;
  (pTVar1->value_).f[10] = (code)0x0;
  pTVar3 = L->top;
  if ((((pTVar3[-1].tt_ & 0x40) != 0) && (((byte)pTVar3[-1].value_.f[9] & 3) != 0)) &&
     (((((pTVar1->value_).gc)->gch).marked & 4) != 0)) {
    luaC_barrierback_(L,(pTVar1->value_).gc);
    pTVar3 = L->top;
  }
  L->top = pTVar3 + -2;
  return;
}

Assistant:

LUA_API void lua_rawset (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  setobj2t(L, luaH_set(L, hvalue(t), L->top-2), L->top-1);
  invalidateTMcache(hvalue(t));
  luaC_barrierback(L, gcvalue(t), L->top-1);
  L->top -= 2;
  lua_unlock(L);
}